

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# COLLADASaxFWLLibraryEffectsLoader.cpp
# Opt level: O3

bool __thiscall
COLLADASaxFWL::LibraryEffectsLoader::data__minfilter
          (LibraryEffectsLoader *this,ENUM__fx_sampler_filter_common value)

{
  SamplerFilter SVar1;
  
  if (this->mCurrentSampler != (Sampler *)0x0) {
    SVar1 = SAMPLER_FILTER_UNSPECIFIED;
    if (value < (ENUM__fx_sampler_filter_common__NOT_PRESENT|ENUM__fx_sampler_filter_common__NEAREST
                )) {
      SVar1 = *(SamplerFilter *)(&DAT_00838100 + (ulong)value * 4);
    }
    this->mCurrentSampler->mMinFilter = SVar1;
  }
  return true;
}

Assistant:

bool LibraryEffectsLoader::data__minfilter( const ENUM__fx_sampler_filter_common value )
    {
        COLLADAFW::Sampler::SamplerFilter filter = COLLADAFW::Sampler::SAMPLER_FILTER_UNSPECIFIED;
        if ( mCurrentSampler ) {
            switch (value) {
                case ENUM__fx_sampler_filter_common__NOT_PRESENT:
                case ENUM__fx_sampler_filter_common__COUNT:
                case ENUM__fx_sampler_filter_common__NONE:
                    filter = COLLADAFW::Sampler::SAMPLER_FILTER_NONE;
                    break;
                case ENUM__fx_sampler_filter_common__NEAREST:
                    filter = COLLADAFW::Sampler::SAMPLER_FILTER_NEAREST;
                    break;
                case ENUM__fx_sampler_filter_common__LINEAR:
                    filter = COLLADAFW::Sampler::SAMPLER_FILTER_LINEAR;
                    break;
                case ENUM__fx_sampler_filter_common__NEAREST_MIPMAP_NEAREST:
                    filter = COLLADAFW::Sampler::SAMPLER_FILTER_NEAREST_MIPMAP_NEAREST;
                    break;
                case ENUM__fx_sampler_filter_common__LINEAR_MIPMAP_NEAREST:
                    filter = COLLADAFW::Sampler::SAMPLER_FILTER_LINEAR_MIPMAP_NEAREST;
                    break;
                case ENUM__fx_sampler_filter_common__NEAREST_MIPMAP_LINEAR:
                    filter = COLLADAFW::Sampler::SAMPLER_FILTER_NEAREST_MIPMAP_LINEAR;
                    break;
                case ENUM__fx_sampler_filter_common__LINEAR_MIPMAP_LINEAR:
                    filter = COLLADAFW::Sampler::SAMPLER_FILTER_LINEAR_MIPMAP_LINEAR;
                    break;
            }
            mCurrentSampler->setMinFilter(filter);
        }
        
        return true;
    }